

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O0

ConstPixelBufferAccess * __thiscall
vkt::Draw::Image::readSurface
          (ConstPixelBufferAccess *__return_storage_ptr__,Image *this,VkQueue queue,
          Allocator *allocator,VkImageLayout layout,VkOffset3D offset,int width,int height,
          VkImageAspectFlagBits aspect,uint mipLevel,uint arrayElement)

{
  VkOffset3D offset_00;
  VkImageLayout VVar1;
  Allocator *pAVar2;
  Allocator *pAVar3;
  int iVar4;
  uchar *puVar5;
  size_type numBytes;
  TextureFormat local_90;
  VkOffset3D local_88;
  VkOffset3D local_78;
  VkOffset3D local_6c;
  VkOffset3D local_5c;
  TextureFormat local_50;
  int local_48;
  VkImageLayout local_44;
  int width_local;
  VkImageLayout layout_local;
  Allocator *allocator_local;
  VkQueue queue_local;
  Image *this_local;
  
  local_48 = width;
  local_44 = layout;
  _width_local = allocator;
  allocator_local = (Allocator *)queue;
  queue_local = (VkQueue)this;
  this_local = (Image *)__return_storage_ptr__;
  local_50 = ::vk::mapVkFormat(this->m_format);
  iVar4 = tcu::TextureFormat::getPixelSize(&local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_pixelAccessData,(long)(width * height * iVar4));
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (&this->m_pixelAccessData);
  numBytes = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       (&this->m_pixelAccessData);
  ::deMemset(puVar5,0,numBytes);
  pAVar3 = allocator_local;
  pAVar2 = _width_local;
  VVar1 = local_44;
  if (aspect == VK_IMAGE_ASPECT_COLOR_BIT) {
    local_5c.x = offset.x;
    local_5c.y = offset.y;
    local_5c.z = offset.z;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->m_pixelAccessData);
    local_6c.x = local_5c.x;
    local_6c.y = local_5c.y;
    local_6c.z = local_5c.z;
    read(this,(int)pAVar3,pAVar2,(ulong)VVar1);
  }
  pAVar3 = allocator_local;
  pAVar2 = _width_local;
  VVar1 = local_44;
  iVar4 = local_48;
  if ((aspect == VK_IMAGE_ASPECT_DEPTH_BIT) || (aspect == VK_IMAGE_ASPECT_STENCIL_BIT)) {
    local_78.x = offset.x;
    local_78.y = offset.y;
    local_78.z = offset.z;
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       (&this->m_pixelAccessData);
    local_88.x = local_78.x;
    local_88.y = local_78.y;
    local_88.z = local_78.z;
    offset_00.z = local_78.z;
    offset_00.x = local_78.x;
    offset_00.y = local_78.y;
    readUsingBuffer(this,(VkQueue)pAVar3,pAVar2,VVar1,offset_00,iVar4,height,1,mipLevel,arrayElement
                    ,aspect,puVar5);
  }
  local_90 = ::vk::mapVkFormat(this->m_format);
  iVar4 = local_48;
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (&this->m_pixelAccessData);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,&local_90,iVar4,height,1,puVar5);
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess Image::readSurface (vk::VkQueue					queue,
												vk::Allocator&				allocator,
												vk::VkImageLayout			layout,
												vk::VkOffset3D				offset,
												int							width,
												int							height,
												vk::VkImageAspectFlagBits	aspect,
												unsigned int				mipLevel,
												unsigned int				arrayElement)
{
	m_pixelAccessData.resize(width * height * vk::mapVkFormat(m_format).getPixelSize());
	deMemset(m_pixelAccessData.data(), 0, m_pixelAccessData.size());
	if (aspect == vk::VK_IMAGE_ASPECT_COLOR_BIT)
	{
		read(queue, allocator, layout, offset, width, height, 1, mipLevel, arrayElement, aspect, vk::VK_IMAGE_TYPE_2D,
		m_pixelAccessData.data());
	}
	if (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT || aspect == vk::VK_IMAGE_ASPECT_STENCIL_BIT)
	{
		readUsingBuffer(queue, allocator, layout, offset, width, height, 1, mipLevel, arrayElement, aspect, m_pixelAccessData.data());
	}
	return tcu::ConstPixelBufferAccess(vk::mapVkFormat(m_format), width, height, 1, m_pixelAccessData.data());
}